

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O3

MPP_RET realloc_buffer(RK_U8 **buf,RK_U32 *max_size,RK_U32 add_size)

{
  RK_U8 *pRVar1;
  MPP_RET MVar2;
  uint uVar3;
  
  if (*buf == (RK_U8 *)0x0) {
    MVar2 = MPP_ERR_MALLOC;
    if (((byte)h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","[realloc_buffer] pointer is null, %p \n",(char *)0x0,0);
    }
  }
  else {
    uVar3 = add_size + 0xf & 0xfffffff0;
    pRVar1 = (RK_U8 *)mpp_osal_realloc("realloc_buffer",*buf,(ulong)(*max_size + uVar3));
    *buf = pRVar1;
    if (pRVar1 == (RK_U8 *)0x0) {
      MVar2 = MPP_ERR_MALLOC;
      if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_parse","[realloc_buffer] ERROR: max_size=%d, add_size=%d \n",(char *)0x0
                   ,(ulong)*max_size,(ulong)uVar3);
      }
    }
    else {
      *max_size = *max_size + uVar3;
      MVar2 = MPP_OK;
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET realloc_buffer(RK_U8 **buf, RK_U32 *max_size, RK_U32 add_size)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    if ((*buf) == NULL) {
        H264D_ERR("[realloc_buffer] pointer is null, %p \n", (*buf));
        ret = MPP_ERR_MALLOC;
        goto __FAILED;
    }

    add_size = MPP_ALIGN(add_size, 16);

    (*buf) = mpp_realloc((*buf), RK_U8, ((*max_size) + add_size));
    if ((*buf) == NULL) {
        H264D_ERR("[realloc_buffer] ERROR: max_size=%d, add_size=%d \n", (*max_size), add_size);
        ret = MPP_ERR_MALLOC;
        goto __FAILED;
    }
    (*max_size) += add_size;

    return ret = MPP_OK;
__FAILED:
    return ret;
}